

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

void light_free_file_info(light_pcapng_file_info *info)

{
  void *in_RDI;
  
  if (*(long *)((long)in_RDI + 0x38) != 0) {
    free(*(void **)((long)in_RDI + 0x38));
  }
  if (*(long *)((long)in_RDI + 8) != 0) {
    free(*(void **)((long)in_RDI + 8));
  }
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    free(*(void **)((long)in_RDI + 0x18));
  }
  if (*(long *)((long)in_RDI + 0x28) != 0) {
    free(*(void **)((long)in_RDI + 0x28));
  }
  free(in_RDI);
  return;
}

Assistant:

void light_free_file_info(light_pcapng_file_info *info)
{
	if (info->user_app_desc != NULL)
		free(info->user_app_desc);

	if (info->file_comment != NULL)
		free(info->file_comment);

	if (info->hardware_desc != NULL)
		free(info->hardware_desc);

	if (info->os_desc != NULL)
		free(info->os_desc);

	free(info);
}